

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O0

void Abc_NodeSuperChoiceCollect2(Abc_Obj_t *pRoot,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vVolume)

{
  int iVar1;
  void *pvVar2;
  undefined4 local_2c;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vVolume_local;
  Vec_Ptr_t *vLeaves_local;
  Abc_Obj_t *pRoot_local;
  
  for (local_2c = 0; iVar1 = Vec_PtrSize(vLeaves), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar2 = Vec_PtrEntry(vLeaves,local_2c);
    *(uint *)((long)pvVar2 + 0x14) = *(uint *)((long)pvVar2 + 0x14) & 0xffffffbf | 0x40;
  }
  Vec_PtrClear(vVolume);
  Abc_NodeSuperChoiceCollect2_rec(pRoot,vVolume);
  for (local_2c = 0; iVar1 = Vec_PtrSize(vLeaves), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar2 = Vec_PtrEntry(vLeaves,local_2c);
    *(uint *)((long)pvVar2 + 0x14) = *(uint *)((long)pvVar2 + 0x14) & 0xffffffbf;
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(vVolume), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar2 = Vec_PtrEntry(vVolume,local_2c);
    *(uint *)((long)pvVar2 + 0x14) = *(uint *)((long)pvVar2 + 0x14) & 0xffffffbf;
  }
  return;
}

Assistant:

void Abc_NodeSuperChoiceCollect2( Abc_Obj_t * pRoot, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVolume )
{
    Abc_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
        pObj->fMarkC = 1;
    Vec_PtrClear( vVolume );
    Abc_NodeSuperChoiceCollect2_rec( pRoot, vVolume );
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
        pObj->fMarkC = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vVolume, pObj, i )
        pObj->fMarkC = 0;
}